

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.hh
# Opt level: O3

unsigned_long
phosg::parallel_range<unsigned_long>
          (function<bool_(unsigned_long,_unsigned_long)> *fn,unsigned_long start_value,
          unsigned_long end_value,size_t num_threads,
          function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *progress_fn)

{
  __atomic_base<unsigned_long> _Var1;
  unsigned_long __args;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *this;
  uint uVar2;
  ulong uVar3;
  uint64_t __args_3;
  pointer ptVar4;
  thread *t;
  pointer ptVar5;
  atomic<unsigned_long> result_value;
  atomic<unsigned_long> current_value;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  __atomic_base<unsigned_long> local_98;
  atomic<unsigned_long> local_90;
  vector<std::thread,_std::allocator<std::thread>_> local_88;
  __atomic_base<unsigned_long> local_68;
  unsigned_long local_60;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *local_58;
  ulong local_50;
  reference_wrapper<std::atomic<unsigned_long>_> local_48;
  reference_wrapper<std::atomic<unsigned_long>_> local_40;
  reference_wrapper<std::function<bool_(unsigned_long,_unsigned_long)>_> local_38;
  
  local_68._M_i = end_value;
  local_60 = start_value;
  local_58 = progress_fn;
  local_98._M_i = end_value;
  local_90.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)start_value;
  if (num_threads == 0) {
    uVar2 = ::std::thread::hardware_concurrency();
    local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (uVar2 == 0) goto LAB_001071a9;
    num_threads = (size_t)uVar2;
  }
  local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uVar3 = 0;
  do {
    local_40._M_data = &local_90;
    local_48._M_data = (atomic<unsigned_long> *)&local_98;
    local_50 = uVar3;
    local_38._M_data = fn;
    ::std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(std::function<bool(unsigned_long,unsigned_long)>&,std::atomic<unsigned_long>&,std::atomic<unsigned_long>&,unsigned_long,unsigned_long),std::reference_wrapper<std::function<bool(unsigned_long,unsigned_long)>>,std::reference_wrapper<std::atomic<unsigned_long>>,std::reference_wrapper<std::atomic<unsigned_long>>,unsigned_long&,unsigned_long>
              ((vector<std::thread,std::allocator<std::thread>> *)&local_88,
               parallel_range_thread_fn<unsigned_long>,&local_38,&local_40,&local_48,&local_68._M_i,
               &local_50);
    uVar3 = (long)local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  } while (uVar3 < num_threads);
LAB_001071a9:
  this = local_58;
  ptVar4 = local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar5 = local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_58->super__Function_base)._M_manager != (_Manager_type)0x0) {
    __args_3 = now();
    __args = local_60;
    while (ptVar4 = local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish,
          ptVar5 = local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start,
          (ulong)local_90.super___atomic_base<unsigned_long>._M_i < local_68._M_i) {
      ::std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::operator()
                (this,__args,local_68._M_i,
                 (unsigned_long)local_90.super___atomic_base<unsigned_long>._M_i,__args_3);
      usleep(1000000);
    }
  }
  for (; _Var1._M_i = local_98._M_i, ptVar5 != ptVar4; ptVar5 = ptVar5 + 1) {
    ::std::thread::join();
  }
  ::std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_88);
  return _Var1._M_i;
}

Assistant:

IntT parallel_range(
    std::function<bool(IntT value, size_t thread_num)> fn,
    IntT start_value,
    IntT end_value,
    size_t num_threads = 0,
    std::function<void(IntT start_value, IntT end_value, IntT current_value, uint64_t start_time_usecs)> progress_fn = parallel_range_default_progress_fn<IntT>) {
  if (num_threads == 0) {
    num_threads = std::thread::hardware_concurrency();
  }

  std::atomic<IntT> current_value(start_value);
  std::atomic<IntT> result_value(end_value);
  std::vector<std::thread> threads;
  while (threads.size() < num_threads) {
    threads.emplace_back(
        parallel_range_thread_fn<IntT>,
        std::ref(fn),
        std::ref(current_value),
        std::ref(result_value),
        end_value,
        threads.size());
  }

  if (progress_fn != nullptr) {
    uint64_t start_time = now();
    IntT progress_current_value;
    while ((progress_current_value = current_value.load()) < end_value) {
      progress_fn(start_value, end_value, progress_current_value, start_time);
      usleep(1000000);
    }
  }

  for (auto& t : threads) {
    t.join();
  }

  return result_value;
}